

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

VTimeZone * __thiscall icu_63::VTimeZone::operator=(VTimeZone *this,VTimeZone *right)

{
  bool bVar1;
  int iVar2;
  ulong in_RAX;
  undefined4 extraout_var;
  UVector *pUVar3;
  long *plVar4;
  void *obj;
  VTimeZone *size;
  int index;
  UErrorCode status;
  undefined8 uStack_38;
  
  if ((this != right) &&
     (uStack_38 = in_RAX,
     iVar2 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0x15])(this),
     (char)iVar2 != '\0')) {
    size = right;
    TimeZone::operator=((TimeZone *)this,(TimeZone *)right);
    if (this->tz != (BasicTimeZone *)0x0) {
      (*(this->tz->super_TimeZone).super_UObject._vptr_UObject[1])();
      this->tz = (BasicTimeZone *)0x0;
    }
    if (right->tz != (BasicTimeZone *)0x0) {
      iVar2 = (*(right->tz->super_TimeZone).super_UObject._vptr_UObject[0xc])();
      this->tz = (BasicTimeZone *)CONCAT44(extraout_var,iVar2);
    }
    if (this->vtzlines != (UVector *)0x0) {
      (*(this->vtzlines->super_UObject)._vptr_UObject[1])();
    }
    if (right->vtzlines != (UVector *)0x0) {
      uStack_38 = uStack_38 & 0xffffffff;
      iVar2 = right->vtzlines->count;
      pUVar3 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
      if (pUVar3 == (UVector *)0x0) {
        bVar1 = true;
      }
      else {
        UVector::UVector(pUVar3,uprv_deleteUObject_63,uhash_compareUnicodeString_63,iVar2,
                         (UErrorCode *)((long)&uStack_38 + 4));
        bVar1 = uStack_38._4_4_ < 1;
      }
      this->vtzlines = pUVar3;
      if ((bool)(0 < iVar2 & bVar1)) {
        index = 0;
        do {
          plVar4 = (long *)UVector::elementAt(right->vtzlines,index);
          pUVar3 = this->vtzlines;
          obj = (void *)(**(code **)(*plVar4 + 0x38))(plVar4);
          UVector::addElement(pUVar3,obj,(UErrorCode *)((long)&uStack_38 + 4));
          if (0 < uStack_38._4_4_) goto LAB_002083d5;
          index = index + 1;
        } while (iVar2 != index);
      }
      else if (!bVar1) {
LAB_002083d5:
        if (this->vtzlines != (UVector *)0x0) {
          (*(this->vtzlines->super_UObject)._vptr_UObject[1])();
          this->vtzlines = (UVector *)0x0;
        }
      }
    }
    UnicodeString::operator=(&this->tzurl,&right->tzurl);
    this->lastmod = right->lastmod;
    UnicodeString::operator=(&this->olsonzid,&right->olsonzid);
    UnicodeString::operator=(&this->icutzver,&right->icutzver);
  }
  return this;
}

Assistant:

VTimeZone&
VTimeZone::operator=(const VTimeZone& right) {
    if (this == &right) {
        return *this;
    }
    if (*this != right) {
        BasicTimeZone::operator=(right);
        if (tz != NULL) {
            delete tz;
            tz = NULL;
        }
        if (right.tz != NULL) {
            tz = (BasicTimeZone*)right.tz->clone();
        }
        if (vtzlines != NULL) {
            delete vtzlines;
        }
        if (right.vtzlines != NULL) {
            UErrorCode status = U_ZERO_ERROR;
            int32_t size = right.vtzlines->size();
            vtzlines = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, size, status);
            if (U_SUCCESS(status)) {
                for (int32_t i = 0; i < size; i++) {
                    UnicodeString *line = (UnicodeString*)right.vtzlines->elementAt(i);
                    vtzlines->addElement(line->clone(), status);
                    if (U_FAILURE(status)) {
                        break;
                    }
                }
            }
            if (U_FAILURE(status) && vtzlines != NULL) {
                delete vtzlines;
                vtzlines = NULL;
            }
        }
        tzurl = right.tzurl;
        lastmod = right.lastmod;
        olsonzid = right.olsonzid;
        icutzver = right.icutzver;
    }
    return *this;
}